

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

IndexStorageInfo * __thiscall
duckdb::ART::GetStorageInfo
          (IndexStorageInfo *__return_storage_ptr__,ART *this,case_insensitive_map_t<Value> *options
          ,bool to_wal)

{
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *this_00;
  pointer *ppuVar1;
  pointer pcVar2;
  bool v1_0_0_storage;
  const_iterator cVar3;
  type paVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  FixedSizeAllocatorInfo local_f0;
  Value local_70;
  
  ppuVar1 = (pointer *)
            ((long)&local_f0.buffer_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_f0.segment_size = (idx_t)ppuVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"v1_0_0_storage","");
  cVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&options->_M_h,(key_type *)&local_f0);
  if ((pointer *)local_f0.segment_size != ppuVar1) {
    operator_delete((void *)local_f0.segment_size);
  }
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
      ._M_cur == (__node_type *)0x0) {
    v1_0_0_storage = true;
  }
  else {
    Value::Value(&local_70,false);
    v1_0_0_storage =
         Value::operator!=((Value *)((long)cVar3.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                           ._M_cur + 0x28),&local_70);
    Value::~Value(&local_70);
  }
  if (v1_0_0_storage != false) {
    TransformToDeprecated(this);
  }
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  pcVar2 = (this->super_BoundIndex).name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (this->super_BoundIndex).name._M_string_length);
  (__return_storage_ptr__->options)._M_h._M_buckets =
       &(__return_storage_ptr__->options)._M_h._M_single_bucket;
  (__return_storage_ptr__->options)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->options)._M_h._M_element_count = 0;
  (__return_storage_ptr__->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->options)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->allocator_infos).
  super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>.
  super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->buffers).
  super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->root_block_ptr).block_id = -1;
  (__return_storage_ptr__->root_block_ptr).offset = 0;
  (__return_storage_ptr__->root_block_ptr).unused_padding = 0;
  __return_storage_ptr__->root = (this->tree).super_IndexPointer.data;
  if (&__return_storage_ptr__->options != options) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&__return_storage_ptr__->options,&options->_M_h);
  }
  this_00 = &this->allocators;
  paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(this_00);
  lVar5 = 0;
  do {
    FixedSizeAllocator::RemoveEmptyBuffers
              (*(FixedSizeAllocator **)
                ((long)&paVar4->_M_elems[0].
                        super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                        .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> + lVar5));
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x48);
  uVar7 = (ulong)(byte)((v1_0_0_storage == false) * '\x03' + 6);
  if (to_wal) {
    uVar6 = 0;
    do {
      paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(this_00);
      FixedSizeAllocator::InitSerializationToWAL
                ((vector<duckdb::IndexBufferInfo,_true> *)&local_f0,
                 (FixedSizeAllocator *)
                 paVar4->_M_elems[uVar6].
                 super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
      ::std::
      vector<duckdb::vector<duckdb::IndexBufferInfo,true>,std::allocator<duckdb::vector<duckdb::IndexBufferInfo,true>>>
      ::emplace_back<duckdb::vector<duckdb::IndexBufferInfo,true>>
                ((vector<duckdb::vector<duckdb::IndexBufferInfo,true>,std::allocator<duckdb::vector<duckdb::IndexBufferInfo,true>>>
                  *)&__return_storage_ptr__->buffers,
                 (vector<duckdb::IndexBufferInfo,_true> *)&local_f0);
      if ((pointer *)local_f0.segment_size != (pointer *)0x0) {
        operator_delete((void *)local_f0.segment_size);
      }
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  else {
    WritePartialBlocks(this,v1_0_0_storage);
  }
  uVar6 = 0;
  do {
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(this_00);
    FixedSizeAllocator::GetInfo
              (&local_f0,
               (FixedSizeAllocator *)
               paVar4->_M_elems[uVar6].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
    ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
    emplace_back<duckdb::FixedSizeAllocatorInfo>
              (&(__return_storage_ptr__->allocator_infos).
                super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
               ,&local_f0);
    if (local_f0.buffers_with_free_space.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
        .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.buffers_with_free_space.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f0.allocation_sizes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.allocation_sizes.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f0.segment_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.segment_counts.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f0.block_pointers.
        super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
        super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.block_pointers.
                      super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
                      super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f0.buffer_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.buffer_ids.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    uVar6 = uVar6 + 1;
  } while (uVar7 != uVar6);
  return __return_storage_ptr__;
}

Assistant:

IndexStorageInfo ART::GetStorageInfo(const case_insensitive_map_t<Value> &options, const bool to_wal) {
	// If the storage format uses deprecated leaf storage,
	// then we need to transform all nested leaves before serialization.
	auto v1_0_0_option = options.find("v1_0_0_storage");
	bool v1_0_0_storage = v1_0_0_option == options.end() || v1_0_0_option->second != Value(false);
	if (v1_0_0_storage) {
		TransformToDeprecated();
	}

	IndexStorageInfo info(name);
	info.root = tree.Get();
	info.options = options;

	for (auto &allocator : *allocators) {
		allocator->RemoveEmptyBuffers();
	}

#ifdef DEBUG
	if (v1_0_0_storage) {
		D_ASSERT((*allocators)[Node::GetAllocatorIdx(NType::NODE_7_LEAF)]->Empty());
		D_ASSERT((*allocators)[Node::GetAllocatorIdx(NType::NODE_15_LEAF)]->Empty());
		D_ASSERT((*allocators)[Node::GetAllocatorIdx(NType::NODE_256_LEAF)]->Empty());
		D_ASSERT((*allocators)[Node::GetAllocatorIdx(NType::PREFIX)]->GetSegmentSize() ==
		         Prefix::DEPRECATED_COUNT + Prefix::METADATA_SIZE);
	}
#endif

	auto allocator_count = v1_0_0_storage ? DEPRECATED_ALLOCATOR_COUNT : ALLOCATOR_COUNT;
	if (!to_wal) {
		// Store the data on disk as partial blocks and set the block ids.
		WritePartialBlocks(v1_0_0_storage);

	} else {
		// Set the correct allocation sizes and get the map containing all buffers.
		for (idx_t i = 0; i < allocator_count; i++) {
			info.buffers.push_back((*allocators)[i]->InitSerializationToWAL());
		}
	}

	for (idx_t i = 0; i < allocator_count; i++) {
		info.allocator_infos.push_back((*allocators)[i]->GetInfo());
	}
	return info;
}